

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O2

bool __thiscall crnd::crn_unpacker::decode_color_selectors(crn_unpacker *this)

{
  vector<unsigned_int> *this_00;
  ushort uVar1;
  crn_header *pcVar2;
  bool bVar3;
  byte bVar4;
  uint32 uVar5;
  uint8 *puVar6;
  uint uVar7;
  uint32 i;
  ulong uVar8;
  uint uVar9;
  char cVar10;
  byte bVar11;
  byte bVar12;
  int iVar13;
  uint32 s;
  uint32 j;
  uint uVar14;
  int iVar15;
  uint uVar16;
  bool bVar17;
  static_huffman_data_model dm;
  
  pcVar2 = this->m_pHeader;
  bVar12 = (pcVar2->m_format).m_buf[0];
  bVar3 = true;
  if (2 < bVar12 - 0xc) {
    bVar17 = true;
    if (bVar12 - 10 < 2) goto LAB_00110d7e;
    bVar3 = false;
  }
  bVar17 = bVar12 == 0xc;
LAB_00110d7e:
  uVar7 = (uint)(pcVar2->m_color_selectors).m_size.m_buf[2] |
          (uint)(pcVar2->m_color_selectors).m_size.m_buf[1] << 8 |
          (uint)(pcVar2->m_color_selectors).m_size.m_buf[0] << 0x10;
  if (uVar7 != 0) {
    puVar6 = this->m_pData +
             ((ulong)(pcVar2->m_color_selectors).m_ofs.m_buf[2] |
             (ulong)((uint)(pcVar2->m_color_selectors).m_ofs.m_buf[0] << 0x10 |
                    (uint)(pcVar2->m_color_selectors).m_ofs.m_buf[1] << 8));
    (this->m_codec).m_pDecode_buf = puVar6;
    (this->m_codec).m_pDecode_buf_next = puVar6;
    (this->m_codec).m_decode_buf_size = uVar7;
    (this->m_codec).m_pDecode_buf_end = puVar6 + uVar7;
    (this->m_codec).m_bit_buf = 0;
    (this->m_codec).m_bit_count = 0;
  }
  dm.m_total_syms = 0;
  dm.m_code_sizes.m_p = (uchar *)0x0;
  dm.m_code_sizes.m_size = 0;
  dm.m_code_sizes.m_capacity = 0;
  dm.m_code_sizes.m_alloc_failed = false;
  dm.m_pDecode_tables = (decoder_tables *)0x0;
  symbol_codec::decode_receive_static_data_model(&this->m_codec,&dm);
  this_00 = &this->m_color_selectors;
  uVar1 = *(ushort *)(this->m_pHeader->m_color_selectors).m_num.m_buf;
  vector<unsigned_int>::resize(this_00,(uint)(ushort)(uVar1 << 8 | uVar1 >> 8) << bVar17);
  uVar7 = 0;
  for (uVar8 = 0; uVar1 = *(ushort *)(this->m_pHeader->m_color_selectors).m_num.m_buf,
      uVar8 < (ushort)(uVar1 << 8 | uVar1 >> 8); uVar8 = uVar8 + 1) {
    for (uVar14 = 0; uVar14 < 0x20; uVar14 = uVar14 + 4) {
      uVar5 = symbol_codec::decode(&this->m_codec,&dm);
      uVar7 = uVar7 ^ uVar5 << ((byte)uVar14 & 0x1f);
    }
    if (bVar3) {
      uVar16 = ~(uVar7 >> 1 & 0x55555555 ^ uVar7);
      uVar14 = (uint)uVar8 * 2 + 1;
      if (bVar17 == false) {
        uVar14 = (uint)uVar8;
      }
      cVar10 = '\0';
      bVar11 = 0;
      bVar12 = 8;
      for (iVar13 = 0; iVar13 != 4; iVar13 = iVar13 + 1) {
        bVar4 = bVar11;
        for (iVar15 = 0; iVar15 != 8; iVar15 = iVar15 + 2) {
          if (bVar17 != false) {
            uVar9 = uVar16 >> (bVar4 & 0x1f);
            this_00->m_p[uVar8 * 2] =
                 this_00->m_p[uVar8 * 2] | ((uVar9 & 1) << 0x10 | uVar9 >> 1 & 1) << (bVar12 & 0xf);
          }
          uVar9 = uVar16 >> (cVar10 + (char)iVar15 & 0x1fU);
          this_00->m_p[uVar14] =
               this_00->m_p[uVar14] | ((uVar9 & 1) << 0x10 | uVar9 >> 1 & 1) << (bVar12 & 0xf);
          bVar12 = bVar12 + 4;
          bVar4 = bVar4 + 8;
        }
        bVar12 = bVar12 - 0xf;
        bVar11 = bVar11 + 2;
        cVar10 = cVar10 + '\b';
      }
    }
    else {
      this_00->m_p[uVar8] = uVar7 >> 1 & 0x55555555 | (uVar7 * 2 ^ uVar7) & 0xaaaaaaaa;
    }
  }
  static_huffman_data_model::~static_huffman_data_model(&dm);
  return true;
}

Assistant:

bool decode_color_selectors() {
    const bool has_etc_color_blocks = m_pHeader->m_format == cCRNFmtETC1 || m_pHeader->m_format == cCRNFmtETC2 || m_pHeader->m_format == cCRNFmtETC2A || m_pHeader->m_format == cCRNFmtETC1S || m_pHeader->m_format == cCRNFmtETC2AS;
    const bool has_subblocks = m_pHeader->m_format == cCRNFmtETC1 || m_pHeader->m_format == cCRNFmtETC2 || m_pHeader->m_format == cCRNFmtETC2A;
    m_codec.start_decoding(m_pData + m_pHeader->m_color_selectors.m_ofs, m_pHeader->m_color_selectors.m_size);
    static_huffman_data_model dm;
    m_codec.decode_receive_static_data_model(dm);
    m_color_selectors.resize(m_pHeader->m_color_selectors.m_num << (has_subblocks ? 1 : 0));
    for (uint32 s = 0, i = 0; i < m_pHeader->m_color_selectors.m_num; i++) {
      for (uint32 j = 0; j < 32; j += 4)
        s ^= m_codec.decode(dm) << j;
      if (has_etc_color_blocks) {
        for (uint32 selector = (~s & 0xAAAAAAAA) | (~(s ^ s >> 1) & 0x55555555), t = 8, h = 0; h < 4; h++, t -= 15) {
          for (uint32 w = 0; w < 4; w++, t += 4) {
            if (has_subblocks) {
              uint32 s0 = selector >> (w << 3 | h << 1);
              m_color_selectors[i << 1] |= ((s0 >> 1 & 1) | (s0 & 1) << 16) << (t & 15);
            }
            uint32 s1 = selector >> (h << 3 | w << 1);
            m_color_selectors[has_subblocks ? i << 1 | 1 : i] |= ((s1 >> 1 & 1) | (s1 & 1) << 16) << (t & 15);
          }
        }
      } else {
        m_color_selectors[i] = ((s ^ s << 1) & 0xAAAAAAAA) | (s >> 1 & 0x55555555);
      }
    }
    m_codec.stop_decoding();
    return true;
  }